

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O0

void __thiscall Spc_Dsp::mute_voices(Spc_Dsp *this,int mask)

{
  int in_ESI;
  Spc_Dsp *in_RDI;
  int i;
  int local_10;
  
  (in_RDI->m).mute_mask = in_ESI;
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    (in_RDI->m).voices[local_10].enabled = (in_ESI >> ((byte)local_10 & 0x1f) & 1U) - 1;
    update_voice_vol(in_RDI,local_10 << 4);
  }
  return;
}

Assistant:

void Spc_Dsp::mute_voices( int mask )
{
	m.mute_mask = mask;
	for ( int i = 0; i < voice_count; i++ )
	{
		m.voices [i].enabled = (mask >> i & 1) - 1;
		update_voice_vol( i * 0x10 );
	}
}